

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O2

void canvas_undo_redo(_glist *x)

{
  _undo_action *p_Var1;
  int oldstate;
  _undo *p_Var2;
  char *redo_action;
  char *pcVar3;
  int iVar4;
  
  p_Var2 = canvas_undo_get(x);
  if (p_Var2 == (_undo *)0x0) {
    return;
  }
  oldstate = canvas_suspend_dsp();
  if ((p_Var2->u_queue != (_undo_action *)0x0) &&
     (p_Var1 = p_Var2->u_last->next, p_Var1 != (_undo_action *)0x0)) {
    p_Var2->u_doing = 1;
    p_Var2->u_last = p_Var1;
    canvas_editmode(x,1.0);
    glist_noselect(x);
    canvas_undo_set_name(p_Var2->u_last->name);
    if (p_Var2->u_last->type == UNDO_SEQUENCE_START) {
      iVar4 = 1;
      do {
        p_Var1 = p_Var2->u_last->next;
        if (p_Var1 == (_undo_action *)0x0) {
          pcVar3 = "undo sequence start without end";
          goto LAB_0015fbaa;
        }
        p_Var2->u_last = p_Var1;
        if (p_Var1->type == UNDO_SEQUENCE_START) {
          iVar4 = iVar4 + 1;
        }
        else if (p_Var1->type == UNDO_SEQUENCE_END) {
          iVar4 = iVar4 + -1;
        }
        else {
          canvas_undo_doit(x,p_Var1,2,"canvas_undo_redo");
        }
      } while (0 < iVar4);
      if (iVar4 < 0) {
        pcVar3 = "undo sequence end without start";
LAB_0015fbaa:
        bug(pcVar3);
      }
    }
    canvas_undo_doit(x,p_Var2->u_last,2,"canvas_undo_redo");
    pcVar3 = p_Var2->u_last->name;
    p_Var1 = p_Var2->u_last->next;
    if (p_Var1 == (_undo_action *)0x0) {
      redo_action = "no";
    }
    else {
      redo_action = p_Var1->name;
    }
    p_Var2->u_doing = 0;
    canvas_show_undomenu(x,pcVar3,redo_action);
    iVar4 = canvas_undo_isdirty(x);
    canvas_dirty(x,(float)iVar4);
  }
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void canvas_undo_redo(t_canvas *x)
{
    int dspwas;
    t_undo *udo = canvas_undo_get(x);
    if (!udo) return;
    dspwas = canvas_suspend_dsp();
    if (udo->u_queue && udo->u_last->next)
    {
        char *undo_action, *redo_action;
        udo->u_doing = 1;
        udo->u_last = udo->u_last->next;
        canvas_editmode(x, 1);
        glist_noselect(x);
        canvas_undo_set_name(udo->u_last->name);

        if(UNDO_SEQUENCE_START == udo->u_last->type)
        {
            int sequence_depth = 1;
            while(udo->u_last->next && (udo->u_last = udo->u_last->next))
            {
                DEBUG_UNDO(post("%s:sequence[%d] %d", __FUNCTION__, sequence_depth, udo->u_last->type));
                switch(udo->u_last->type)
                {
                case UNDO_SEQUENCE_END:
                    sequence_depth--;
                    break;
                case UNDO_SEQUENCE_START:
                    sequence_depth++;
                    break;
                default:
                    canvas_undo_doit(x, udo->u_last, UNDO_REDO, __FUNCTION__);
                }
                if (sequence_depth < 1)
                    break;
            }
            if (sequence_depth < 0)
                bug("undo sequence end without start");
            else if (sequence_depth > 0)
                bug("undo sequence start without end");
        }

        canvas_undo_doit(x, udo->u_last, UNDO_REDO, __FUNCTION__);
        undo_action = udo->u_last->name;
        redo_action = (udo->u_last->next ? udo->u_last->next->name : "no");
        udo->u_doing = 0;
        /* here we call updating of all unpaired hubs and nodes since their
           regular call will fail in case their position needed to be updated
           by undo/redo first to reflect the old one */
        canvas_show_undomenu(x, undo_action, redo_action);
        canvas_dirty(x, canvas_undo_isdirty(x));
    }
    canvas_resume_dsp(dspwas);
}